

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O3

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  undefined1 uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined1 uVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  ulong local_58;
  
  iVar10 = bottom_blob->dims;
  if (iVar10 == 3) {
    uVar1 = bottom_blob->c;
    uVar12 = bottom_blob->h * bottom_blob->w;
    if (this->bias_term == 0) {
      if (0 < (int)uVar1) {
        local_58 = 0;
        do {
          if (0 < (int)uVar12) {
            sVar4 = bottom_blob->elemsize;
            lVar15 = top_blob->elemsize * top_blob->cstep * local_58;
            pvVar2 = top_blob->data;
            sVar5 = bottom_blob->cstep;
            pvVar3 = bottom_blob->data;
            uVar8 = 0;
            do {
              fVar16 = roundf((float)*(int *)((long)pvVar3 + uVar8 * 4 + sVar4 * sVar5 * local_58) *
                              this->scale_in * this->scale_out);
              iVar6 = (int)fVar16;
              iVar10 = iVar6;
              if (iVar6 < -0x7e) {
                iVar10 = -0x7f;
              }
              if (0x7e < iVar10) {
                iVar10 = 0x7f;
              }
              uVar9 = (undefined1)iVar10;
              *(undefined1 *)((long)pvVar2 + uVar8 + lVar15) = uVar9;
              uVar13 = uVar9;
              if (this->fusion_relu != false) {
                uVar13 = 0;
              }
              if (-1 < iVar6) {
                uVar13 = uVar9;
              }
              *(undefined1 *)((long)pvVar2 + uVar8 + lVar15) = uVar13;
              uVar8 = uVar8 + 1;
            } while (uVar12 != uVar8);
          }
          local_58 = local_58 + 1;
        } while (local_58 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        uVar14 = 0;
        if (1 < this->bias_data_size) {
          uVar14 = uVar8;
        }
        if (0 < (int)uVar12) {
          sVar4 = bottom_blob->elemsize;
          fVar16 = *(float *)((long)(this->bias_data).data + uVar14 * 4);
          lVar15 = top_blob->elemsize * top_blob->cstep * uVar8;
          pvVar2 = top_blob->data;
          sVar5 = bottom_blob->cstep;
          pvVar3 = bottom_blob->data;
          uVar14 = 0;
          do {
            fVar17 = roundf(((float)*(int *)((long)pvVar3 + uVar14 * 4 + sVar4 * sVar5 * uVar8) *
                             this->scale_in + fVar16) * this->scale_out);
            iVar6 = (int)fVar17;
            iVar10 = iVar6;
            if (iVar6 < -0x7e) {
              iVar10 = -0x7f;
            }
            if (0x7e < iVar10) {
              iVar10 = 0x7f;
            }
            uVar9 = (undefined1)iVar10;
            *(undefined1 *)((long)pvVar2 + uVar14 + lVar15) = uVar9;
            uVar13 = uVar9;
            if (this->fusion_relu != false) {
              uVar13 = 0;
            }
            if (-1 < iVar6) {
              uVar13 = uVar9;
            }
            *(undefined1 *)((long)pvVar2 + uVar14 + lVar15) = uVar13;
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar1);
    }
  }
  else if (iVar10 == 2) {
    uVar1 = bottom_blob->w;
    uVar12 = bottom_blob->h;
    if (this->bias_term == 0) {
      if (0 < (int)uVar12) {
        local_58._0_4_ = 0;
        do {
          if (0 < (int)uVar1) {
            lVar15 = (long)(int)(top_blob->w * (uint)local_58) * top_blob->elemsize;
            pvVar2 = top_blob->data;
            iVar10 = bottom_blob->w;
            sVar4 = bottom_blob->elemsize;
            pvVar3 = bottom_blob->data;
            uVar8 = 0;
            do {
              fVar16 = roundf((float)*(int *)((long)pvVar3 +
                                             uVar8 * 4 +
                                             (long)(int)(iVar10 * (uint)local_58) * sVar4) *
                              this->scale_in * this->scale_out);
              iVar7 = (int)fVar16;
              iVar6 = iVar7;
              if (iVar7 < -0x7e) {
                iVar6 = -0x7f;
              }
              if (0x7e < iVar6) {
                iVar6 = 0x7f;
              }
              uVar9 = (undefined1)iVar6;
              *(undefined1 *)((long)pvVar2 + uVar8 + lVar15) = uVar9;
              uVar13 = uVar9;
              if (this->fusion_relu != false) {
                uVar13 = 0;
              }
              if (-1 < iVar7) {
                uVar13 = uVar9;
              }
              *(undefined1 *)((long)pvVar2 + uVar8 + lVar15) = uVar13;
              uVar8 = uVar8 + 1;
            } while (uVar1 != uVar8);
          }
          local_58._0_4_ = (uint)local_58 + 1;
        } while ((uint)local_58 != uVar12);
      }
    }
    else if (0 < (int)uVar12) {
      uVar11 = 0;
      do {
        uVar8 = 0;
        if (1 < this->bias_data_size) {
          uVar8 = (ulong)uVar11;
        }
        if (0 < (int)uVar1) {
          lVar15 = (long)(int)(top_blob->w * uVar11) * top_blob->elemsize;
          pvVar2 = top_blob->data;
          iVar10 = bottom_blob->w;
          sVar4 = bottom_blob->elemsize;
          fVar16 = *(float *)((long)(this->bias_data).data + uVar8 * 4);
          pvVar3 = bottom_blob->data;
          uVar8 = 0;
          do {
            fVar17 = roundf(((float)*(int *)((long)pvVar3 +
                                            uVar8 * 4 + (long)(int)(iVar10 * uVar11) * sVar4) *
                             this->scale_in + fVar16) * this->scale_out);
            iVar7 = (int)fVar17;
            iVar6 = iVar7;
            if (iVar7 < -0x7e) {
              iVar6 = -0x7f;
            }
            if (0x7e < iVar6) {
              iVar6 = 0x7f;
            }
            uVar9 = (undefined1)iVar6;
            *(undefined1 *)((long)pvVar2 + uVar8 + lVar15) = uVar9;
            uVar13 = uVar9;
            if (this->fusion_relu != false) {
              uVar13 = 0;
            }
            if (-1 < iVar7) {
              uVar13 = uVar9;
            }
            *(undefined1 *)((long)pvVar2 + uVar8 + lVar15) = uVar13;
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar12);
    }
  }
  else if (iVar10 == 1) {
    uVar1 = bottom_blob->w;
    uVar8 = (ulong)uVar1;
    pvVar2 = bottom_blob->data;
    pvVar3 = top_blob->data;
    if (this->bias_term == 0) {
      if (0 < (int)uVar1) {
        uVar14 = 0;
        do {
          fVar16 = roundf((float)*(int *)((long)pvVar2 + uVar14 * 4) * this->scale_in *
                          this->scale_out);
          iVar6 = (int)fVar16;
          iVar10 = iVar6;
          if (iVar6 < -0x7e) {
            iVar10 = -0x7f;
          }
          if (0x7e < iVar10) {
            iVar10 = 0x7f;
          }
          uVar9 = (undefined1)iVar10;
          *(undefined1 *)((long)pvVar3 + uVar14) = uVar9;
          uVar13 = uVar9;
          if (this->fusion_relu != false) {
            uVar13 = 0;
          }
          if (-1 < iVar6) {
            uVar13 = uVar9;
          }
          *(undefined1 *)((long)pvVar3 + uVar14) = uVar13;
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
    }
    else if (this->bias_data_size < 2) {
      if (0 < (int)uVar1) {
        fVar16 = *(this->bias_data).data;
        uVar14 = 0;
        do {
          fVar17 = roundf(((float)*(int *)((long)pvVar2 + uVar14 * 4) * this->scale_in + fVar16) *
                          this->scale_out);
          iVar6 = (int)fVar17;
          iVar10 = iVar6;
          if (iVar6 < -0x7e) {
            iVar10 = -0x7f;
          }
          if (0x7e < iVar10) {
            iVar10 = 0x7f;
          }
          uVar9 = (undefined1)iVar10;
          *(undefined1 *)((long)pvVar3 + uVar14) = uVar9;
          uVar13 = uVar9;
          if (this->fusion_relu != false) {
            uVar13 = 0;
          }
          if (-1 < iVar6) {
            uVar13 = uVar9;
          }
          *(undefined1 *)((long)pvVar3 + uVar14) = uVar13;
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
    }
    else if (0 < (int)uVar1) {
      uVar14 = 0;
      do {
        fVar16 = roundf(((float)*(int *)((long)pvVar2 + uVar14 * 4) * this->scale_in +
                        *(float *)((long)(this->bias_data).data + uVar14 * 4)) * this->scale_out);
        iVar6 = (int)fVar16;
        iVar10 = iVar6;
        if (iVar6 < -0x7e) {
          iVar10 = -0x7f;
        }
        if (0x7e < iVar10) {
          iVar10 = 0x7f;
        }
        uVar9 = (undefined1)iVar10;
        *(undefined1 *)((long)pvVar3 + uVar14) = uVar9;
        uVar13 = uVar9;
        if (this->fusion_relu != false) {
          uVar13 = 0;
        }
        if (-1 < iVar6) {
          uVar13 = uVar9;
        }
        *(undefined1 *)((long)pvVar3 + uVar14) = uVar13;
        uVar14 = uVar14 + 1;
      } while (uVar8 != uVar14);
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{ 
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        const int* intptr = bottom_blob;
        signed char * ptr = top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias_data[i]) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
            else
            {
                float bias = bias_data[0];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                if (fusion_relu && ptr[i] < 0)
                    ptr[i] = 0;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(((intptr[j] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                signed char* ptr = top_blob.row<signed char>(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = float2int8(intptr[j] * scale_in * scale_out);
                    if (fusion_relu && ptr[j] < 0)
                        ptr[j] = 0;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;      

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(((intptr[i] * scale_in) + bias) * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                signed char* ptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = float2int8(intptr[i] * scale_in * scale_out);
                    if (fusion_relu && ptr[i] < 0)
                        ptr[i] = 0;
                }
            }
        }    
    }

    return 0;
}